

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_int>::__encodeArray
          (FastPForImpl<4U,_unsigned_int> *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint *puVar1;
  pointer pvVar2;
  pointer __src;
  ulong uVar3;
  uint32_t *puVar4;
  uint *puVar5;
  long lVar6;
  int iVar7;
  uint32_t bit;
  uint32_t k;
  uint uVar8;
  uint uVar9;
  size_t nValue;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  size_t size;
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  uint32_t *local_60;
  uint local_54;
  size_t *local_50;
  FastPForImpl<4U,_unsigned_int> *local_48;
  uint *local_40;
  uint32_t *local_38;
  
  local_60 = out;
  local_50 = nvalue;
  checkifdivisibleby(length,0x80);
  pvVar2 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 8; lVar6 != 800; lVar6 = lVar6 + 0x18) {
    lVar12 = *(long *)((long)pvVar2 + lVar6 + -8);
    if (*(long *)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + lVar6) != lVar12) {
      *(long *)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data + lVar6) = lVar12;
    }
  }
  puVar10 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = in + length;
  puVar4 = local_60 + 1;
  local_48 = this;
  while (in + 0x80 <= local_40) {
    getBestBFromData(this,in,&bestb,&bestcexcept,&maxb);
    *puVar10 = bestb;
    puVar10[1] = bestcexcept;
    if (bestcexcept == '\0') {
      puVar10 = puVar10 + 2;
    }
    else {
      uVar11 = (ulong)maxb;
      uVar3 = (ulong)bestb;
      puVar10[2] = maxb;
      puVar10 = puVar10 + 3;
      pvVar2 = (this->datatobepacked).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = puVar4;
      for (lVar6 = 0; this = local_48, puVar4 = local_38, lVar6 != 0x80; lVar6 = lVar6 + 1) {
        if ((uint)(1L << (uVar3 & 0x3f)) <= in[lVar6]) {
          local_54 = in[lVar6] >> (bestb & 0x1f);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (pvVar2 + (uVar11 - uVar3),&local_54);
          *puVar10 = (uchar)lVar6;
          puVar10 = puVar10 + 1;
        }
      }
    }
    puVar4 = packblockup<128u,unsigned_int>(in,puVar4,(uint)bestb);
    in = in + 0x80;
  }
  *local_60 = (uint32_t)((ulong)((long)puVar4 - (long)local_60) >> 2);
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)puVar10 - (long)__src;
  uVar3 = uVar11 & 0xffffffff;
  *puVar4 = (uint32_t)uVar11;
  memcpy(puVar4 + 1,__src,uVar3);
  puVar1 = (uint *)((long)puVar4 + (uVar3 + 3 & 0xfffffffffffffffc) + 4);
  for (puVar5 = (uint *)((long)puVar4 + uVar3 + 4); puVar5 < puVar1;
      puVar5 = (uint *)((long)puVar5 + 1)) {
    *(undefined1 *)puVar5 = 0;
  }
  pvVar2 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = 2;
  uVar9 = 0;
  for (lVar6 = 0x38; lVar6 != 800; lVar6 = lVar6 + 0x18) {
    uVar8 = (uint)(1L << ((ulong)(iVar7 - 1) & 0x3f));
    if (*(long *)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + lVar6) ==
        *(long *)((long)pvVar2 + lVar6 + -8)) {
      uVar8 = 0;
    }
    iVar7 = iVar7 + 1;
    uVar9 = uVar8 | uVar9;
  }
  *puVar1 = uVar9;
  puVar4 = puVar1 + 1;
  bit = 2;
  for (lVar6 = 0; lVar6 != 0x2e8; lVar6 = lVar6 + 0x18) {
    pvVar2 = (this->datatobepacked).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = *(long *)((long)&pvVar2[2].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + lVar6 + 8) -
             *(long *)((long)&pvVar2[2].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + lVar6);
    if (lVar12 != 0) {
      size = lVar12 >> 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&pvVar2[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data + lVar6),size + 0x1f & 0xffffffffffffffe0);
      puVar4 = packingvector<32U>::packmeuptightwithoutmask<unsigned_int>
                         (*(uint **)((long)&(this->datatobepacked).
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[2].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data + lVar6),size,puVar4,
                          bit);
    }
    bit = bit + 1;
  }
  *local_50 = (long)puVar4 - (long)local_60 >> 2;
  return;
}

Assistant:

void __encodeArray(const IntType *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out;  // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++;  // keep track of this
    for (uint32_t k = 0; k < sizeof(IntType) * 8 + 1; ++k) {
      datatobepacked[k].clear();
    }
    uint8_t *bc = &bytescontainer[0];
    for (const IntType *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<IntType> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const IntType maxval = static_cast<IntType>(1ULL << bestb);
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    IntType bitmap = 0;
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() != 0) bitmap |= (1ULL << (k - 1));
    }
    *(reinterpret_cast<IntType *>(out)) = bitmap;
    out += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);

    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() > 0) {
        size_t nValue = datatobepacked[k].size();
        datatobepacked[k].resize((datatobepacked[k].size() + 32 - 1) / 32 * 32);
        out = packingvector<32>::packmeuptightwithoutmask(
            datatobepacked[k].data(), nValue, out, k);
      }
    }
    nvalue = out - initout;
  }